

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_suffix_array.hpp
# Opt level: O2

bool check_lcp<unsigned_long>
               (string *str,vector<unsigned_long,_std::allocator<unsigned_long>_> *SA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *ISA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *LCP)

{
  ostream *poVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  size_t i;
  ulong uVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ref_LCP;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lcp_from_sa<unsigned_long>
            (str,SA,ISA,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
  puVar2 = (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar3 - (long)puVar2 ==
      (long)local_48._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48._M_impl.super__Vector_impl_data._M_start) {
    bVar4 = true;
    for (uVar5 = 0; uVar5 < (ulong)((long)puVar3 - (long)puVar2 >> 3); uVar5 = uVar5 + 1) {
      if (puVar2[uVar5] != local_48._M_impl.super__Vector_impl_data._M_start[uVar5]) {
        poVar1 = std::operator<<((ostream *)&std::cerr,"[ERROR] LCP[");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1,"]=");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1," != ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1,"=ref_LCP[");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1,"]");
        std::endl<char,std::char_traits<char>>(poVar1);
        puVar2 = (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        bVar4 = false;
      }
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"[ERROR] LCP size is wrong: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"!=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    bVar4 = false;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  return bVar4;
}

Assistant:

bool check_lcp(const std::string& str, const std::vector<index_t>& SA, const std::vector<index_t>& ISA, const std::vector<index_t>& LCP)
{
    // construct reference LCP (sequentially)
    std::vector<index_t> ref_LCP;
    lcp_from_sa(str, SA, ISA, ref_LCP);

    // check if reference is equal to this LCP
    if (LCP.size() != ref_LCP.size())
    {
        std::cerr << "[ERROR] LCP size is wrong: " << LCP.size() << "!=" << ref_LCP.size() << std::endl;
        return false;
    }
    // check that all LCP values are equal
    bool all_correct = true;
    for (std::size_t i = 0; i < LCP.size(); ++i)
    {
        if (LCP[i] != ref_LCP[i])
        {
            std::cerr << "[ERROR] LCP[" << i << "]=" << LCP[i] << " != " << ref_LCP[i] << "=ref_LCP[" << i << "]" << std::endl;
            all_correct = false;
        }
    }
    return all_correct;
}